

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O2

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<short,true,false>(short min_value,short max_value)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  bVar2 = 0x10;
  if (min_value != -0x8000) {
    uVar3 = -(uint)(ushort)min_value;
    if ((short)-(uint)(ushort)min_value <= max_value) {
      uVar3 = (uint)(ushort)max_value;
    }
    if ((short)uVar3 == 0) {
      return '\0';
    }
    bVar1 = 1;
    for (; (short)uVar3 != 0; uVar3 = (uint)(int)(short)uVar3 >> 1) {
      bVar1 = bVar1 + 1;
    }
    bVar2 = 0x10;
    if (bVar1 < 0xf) {
      bVar2 = bVar1;
    }
  }
  return bVar2;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T min_value, T max_value) {
		bitpacking_width_t bitwidth;
		T value;

		if (is_signed) {
			if (min_value == NumericLimits<T>::Minimum()) {
				// handle special case of the minimal value, as it cannot be negated like all other values.
				return sizeof(T) * 8;
			} else {
				value = MaxValue((T)-min_value, max_value);
			}
		} else {
			value = max_value;
		}

		if (value == 0) {
			return 0;
		}

		if (is_signed) {
			bitwidth = 1;
		} else {
			bitwidth = 0;
		}

		while (value) {
			bitwidth++;
			value >>= 1;
		}

		bitwidth = GetEffectiveWidth<T>(bitwidth);

		// Assert results are correct
#ifdef DEBUG
		if (bitwidth < sizeof(T) * 8 && bitwidth != 0) {
			if (is_signed) {
				D_ASSERT(max_value <= (T(1) << (bitwidth - 1)) - 1);
				// D_ASSERT(min_value >= (T(-1) * ((T(1) << (bitwidth - 1)) - 1) - 1));
			} else {
				D_ASSERT(max_value <= (T(1) << (bitwidth)) - 1);
			}
		}
#endif
		if (round_to_next_byte) {
			return (bitwidth / 8 + (bitwidth % 8 != 0)) * 8;
		}
		return bitwidth;
	}